

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bipc.c
# Opt level: O1

void nn_bipc_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  nn_list_item *it;
  
  if (*(int *)&self[1].fn == 2) {
    if (src != 1) {
      if (src == 2) {
        if (type == 0x85b9) {
          nn_list_erase((nn_list *)&self[8].state,(nn_list_item *)((long)srcptr + 0x720));
          nn_aipc_term((nn_aipc *)srcptr);
          nn_free(srcptr);
          return;
        }
        if (type == 0x85b8) {
          nn_aipc_stop((nn_aipc *)srcptr);
          return;
        }
        if (type == 0x85b7) {
          it = nn_list_end((nn_list *)&self[8].state);
          nn_list_insert((nn_list *)&self[8].state,(nn_list_item *)((long)srcptr + 0x720),it);
          self[8].shutdown_fn = (nn_fsm_fn)0x0;
          nn_bipc_start_accepting((nn_bipc *)self);
          return;
        }
        goto LAB_00129188;
      }
      goto LAB_00129179;
    }
    if (0xfffffffd < type - 9U) {
      return;
    }
LAB_0012917e:
    nn_bipc_handler_cold_2();
  }
  else if (*(int *)&self[1].fn == 1) {
    if (src == -2) {
      if (type == -2) {
        *(undefined4 *)&self[1].fn = 2;
        return;
      }
    }
    else {
      nn_bipc_handler_cold_4();
    }
    nn_bipc_handler_cold_5();
LAB_00129179:
    nn_bipc_handler_cold_3();
    goto LAB_0012917e;
  }
  nn_bipc_handler_cold_6();
LAB_00129188:
  nn_bipc_handler_cold_1();
}

Assistant:

static void nn_bipc_handler (struct nn_fsm *self, int src, int type,
    void *srcptr)
{
    struct nn_bipc *bipc;
    struct nn_aipc *aipc;

    bipc = nn_cont (self, struct nn_bipc, fsm);

    switch (bipc->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/******************************************************************************/
    case NN_BIPC_STATE_IDLE:
        nn_assert (src == NN_FSM_ACTION);
        nn_assert (type == NN_FSM_START);
        bipc->state = NN_BIPC_STATE_ACTIVE;
        return;

/******************************************************************************/
/*  ACTIVE state.                                                             */
/*  The execution is yielded to the aipc state machine in this state.         */
/******************************************************************************/
    case NN_BIPC_STATE_ACTIVE:
        if (src == NN_BIPC_SRC_USOCK) {
            nn_assert (type == NN_USOCK_SHUTDOWN || type == NN_USOCK_STOPPED);
            return;
        }

        /* All other events come from child aipc objects. */
        nn_assert (src == NN_BIPC_SRC_AIPC);
        aipc = (struct nn_aipc*) srcptr;
        switch (type) {
        case NN_AIPC_ACCEPTED:

            nn_list_insert (&bipc->aipcs, &aipc->item,
                nn_list_end (&bipc->aipcs));
            bipc->aipc = NULL;
            nn_bipc_start_accepting (bipc);
            return;
        case NN_AIPC_ERROR:
            nn_aipc_stop (aipc);
            return;
        case NN_AIPC_STOPPED:
            nn_list_erase (&bipc->aipcs, &aipc->item);
            nn_aipc_term (aipc);
            nn_free (aipc);
            return;
        default:
            nn_fsm_bad_action (bipc->state, src, type);
        }

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (bipc->state, src, type);
    }
}